

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void xbgr_8888_to_rgba_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (0 < height) {
    puVar4 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
    iVar5 = dst_pitch + 3;
    if (-1 < dst_pitch) {
      iVar5 = dst_pitch;
    }
    iVar7 = src_pitch + 3;
    if (-1 < src_pitch) {
      iVar7 = src_pitch;
    }
    puVar3 = (uint *)((long)src + (long)sx * 4 + (long)(sy * src_pitch));
    iVar6 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar4 + width;
        do {
          uVar2 = *puVar3;
          *puVar4 = (uVar2 | 0xff000000) >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                    uVar2 << 0x18;
          puVar4 = puVar4 + 1;
          puVar3 = puVar3 + 1;
        } while (puVar4 < puVar1);
      }
      puVar3 = puVar3 + ((iVar7 >> 2) - width);
      puVar4 = puVar4 + ((iVar5 >> 2) - width);
      iVar6 = iVar6 + 1;
    } while (iVar6 != height);
  }
  return;
}

Assistant:

static void xbgr_8888_to_rgba_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_XBGR_8888_TO_RGBA_8888(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}